

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface_tests.cpp
# Opt level: O2

void __thiscall
validationinterface_tests::unregister_all_during_call::test_method(unregister_all_during_call *this)

{
  ValidationSignals *this_00;
  function<void_()> on_call;
  function<void_()> on_destroy;
  pointer p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  bool bVar4;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  shared_ptr<CValidationInterface> callbacks;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  ValidationSignals *signals;
  _Manager_type in_stack_fffffffffffffe88;
  _Invoker_type in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  _Manager_type in_stack_fffffffffffffea8;
  _Invoker_type in_stack_fffffffffffffeb0;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  __shared_ptr<CValidationInterface,(__gnu_cxx::_Lock_policy)2> local_b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  shared_ptr<validationinterface_tests::TestInterface> shared;
  bool destroyed;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<validationinterface_tests::TestInterface,_std::allocator<validationinterface_tests::TestInterface>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_90;
  __allocator_type __a2;
  _Function_base local_78;
  code *local_60;
  _Function_base local_58;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<validationinterface_tests::TestInterface,_std::allocator<validationinterface_tests::TestInterface>,_(__gnu_cxx::_Lock_policy)2>_>_>
  *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  destroyed = false;
  signals = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_BasicTestingSetup.m_node.
            validation_signals._M_t.
            super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
            super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
            super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
  p_Var1 = std::
           allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<validationinterface_tests::TestInterface,_std::allocator<validationinterface_tests::TestInterface>,_(__gnu_cxx::_Lock_policy)2>_>_>
           ::allocate(&__a2,1);
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0113ff38;
  local_40 = (__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<validationinterface_tests::TestInterface,_std::allocator<validationinterface_tests::TestInterface>,_(__gnu_cxx::_Lock_policy)2>_>_>
              *)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp:86:9)>
                ::_M_invoke;
  local_58._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp:86:9)>
       ::_M_manager;
  local_78._M_functor._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp:94:9)>
             ::_M_invoke;
  local_78._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp:94:9)>
       ::_M_manager;
  on_call.super__Function_base._M_functor._4_4_ = in_stack_fffffffffffffe7c;
  on_call.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffe78;
  on_call.super__Function_base._M_functor._8_8_ = signals;
  on_call.super__Function_base._M_manager = in_stack_fffffffffffffe88;
  on_call._M_invoker = in_stack_fffffffffffffe90;
  on_destroy.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffea0;
  on_destroy.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffe98
  ;
  on_destroy.super__Function_base._M_manager = in_stack_fffffffffffffea8;
  on_destroy._M_invoker = in_stack_fffffffffffffeb0;
  local_90._M_alloc = &__a2;
  local_78._M_functor._M_unused._M_object = &destroyed;
  local_58._M_functor._M_unused._M_object = this;
  local_58._M_functor._8_8_ = &destroyed;
  TestInterface::TestInterface((TestInterface *)&p_Var1->_M_impl,signals,on_call,on_destroy);
  std::_Function_base::~_Function_base(&local_78);
  std::_Function_base::~_Function_base(&local_58);
  local_90._M_ptr = (pointer)0x0;
  shared.super___shared_ptr<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&p_Var1->_M_impl;
  shared.super___shared_ptr<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = &p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<validationinterface_tests::TestInterface,_std::allocator<validationinterface_tests::TestInterface>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_90);
  this_00 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_BasicTestingSetup.m_node.
            validation_signals._M_t.
            super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
            super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
            super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
  std::__shared_ptr<CValidationInterface,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<validationinterface_tests::TestInterface,void>
            (local_b8,&shared.
                       super___shared_ptr<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2>
            );
  callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b8;
  ValidationSignals::RegisterSharedValidationInterface(this_00,callbacks);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x60;
  file.m_begin = (iterator)&local_c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d8,msg);
  if (shared.
      super___shared_ptr<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = (shared.
             super___shared_ptr<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count == 2;
  }
  local_78._M_functor._8_8_ = 0;
  local_78._M_manager = (_Manager_type)0x0;
  local_90._M_alloc =
       (allocator<std::_Sp_counted_ptr_inplace<validationinterface_tests::TestInterface,_std::allocator<validationinterface_tests::TestInterface>,_(__gnu_cxx::_Lock_policy)2>_>
        *)0xc765b0;
  local_90._M_ptr = (pointer)0xc765c7;
  local_58._M_functor._8_8_ = local_58._M_functor._8_8_ & 0xffffffffffffff00;
  local_58._M_functor._M_unused._M_object = &PTR__lazy_ostream_0113a070;
  local_58._M_manager = (_Manager_type)boost::unit_test::lazy_ostream::inst;
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp"
  ;
  local_e0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_40 = &local_90;
  local_78._M_functor._M_pod_data[0] = bVar4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)&local_58,1,0,WARN,(check_type)signals,
             (size_t)&local_e8,0x60);
  boost::detail::shared_count::~shared_count((shared_count *)&local_78._M_manager);
  TestInterface::Call(shared.
                      super___shared_ptr<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x62;
  file_00.m_begin = (iterator)&local_f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_108,
             msg_00);
  if (shared.
      super___shared_ptr<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_78._M_functor._M_pod_data[0] = false;
  }
  else {
    local_78._M_functor._M_pod_data[0] =
         (shared.
          super___shared_ptr<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi)->_M_use_count == 1;
  }
  local_78._M_functor._8_8_ = 0;
  local_78._M_manager = (_Manager_type)0x0;
  local_90._M_alloc =
       (allocator<std::_Sp_counted_ptr_inplace<validationinterface_tests::TestInterface,_std::allocator<validationinterface_tests::TestInterface>,_(__gnu_cxx::_Lock_policy)2>_>
        *)0xc765c8;
  local_90._M_ptr = (pointer)0xc765df;
  local_58._M_functor._8_8_ = local_58._M_functor._8_8_ & 0xffffffffffffff00;
  local_58._M_functor._M_unused._M_object = &PTR__lazy_ostream_0113a070;
  local_58._M_manager = (_Manager_type)boost::unit_test::lazy_ostream::inst;
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp"
  ;
  local_110 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_40 = &local_90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)&local_58,1,0,WARN,(check_type)signals,
             (size_t)&local_118,0x62);
  boost::detail::shared_count::~shared_count((shared_count *)&local_78._M_manager);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  file_01.m_end = (iterator)0x63;
  file_01.m_begin = (iterator)&local_128;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_138,
             msg_01);
  local_78._M_functor._M_pod_data[0] = destroyed ^ 1;
  local_78._M_functor._8_8_ = 0;
  local_78._M_manager = (_Manager_type)0x0;
  local_90._M_alloc =
       (allocator<std::_Sp_counted_ptr_inplace<validationinterface_tests::TestInterface,_std::allocator<validationinterface_tests::TestInterface>,_(__gnu_cxx::_Lock_policy)2>_>
        *)0xc765e0;
  local_90._M_ptr = (pointer)0xc765ea;
  local_58._M_functor._8_8_ = local_58._M_functor._8_8_ & 0xffffffffffffff00;
  local_58._M_functor._M_unused._M_object = &PTR__lazy_ostream_0113a070;
  local_58._M_manager = (_Manager_type)boost::unit_test::lazy_ostream::inst;
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validationinterface_tests.cpp"
  ;
  local_140 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_40 = &local_90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)&local_58,1,0,WARN,(check_type)signals,
             (size_t)&local_148,99);
  boost::detail::shared_count::~shared_count((shared_count *)&local_78._M_manager);
  std::__shared_ptr<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2>::reset
            (&shared.
              super___shared_ptr<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2>
            );
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  file_02.m_end = (iterator)0x65;
  file_02.m_begin = &stack0xfffffffffffffea8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
             (size_t)&stack0xfffffffffffffe98,msg_02);
  local_78._M_functor._M_pod_data[0] = destroyed;
  local_78._M_functor._8_8_ = 0;
  local_78._M_manager = (_Manager_type)0x0;
  local_90._M_alloc =
       (allocator<std::_Sp_counted_ptr_inplace<validationinterface_tests::TestInterface,_std::allocator<validationinterface_tests::TestInterface>,_(__gnu_cxx::_Lock_policy)2>_>
        *)0xc765e1;
  local_90._M_ptr = (pointer)0xc765ea;
  local_58._M_functor._8_8_ = local_58._M_functor._8_8_ & 0xffffffffffffff00;
  local_58._M_functor._M_unused._M_object = &PTR__lazy_ostream_0113a070;
  local_58._M_manager = (_Manager_type)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)&local_58,1,0,WARN,(check_type)signals,
             (size_t)&stack0xfffffffffffffe88,0x65);
  boost::detail::shared_count::~shared_count((shared_count *)&local_78._M_manager);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&shared.
              super___shared_ptr<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(unregister_all_during_call)
{
    bool destroyed = false;
    auto shared{std::make_shared<TestInterface>(
        *m_node.validation_signals,
        [&] {
            // First call should decrements reference count 2 -> 1
            m_node.validation_signals->UnregisterAllValidationInterfaces();
            BOOST_CHECK(!destroyed);
            // Second call should not decrement reference count 1 -> 0
            m_node.validation_signals->UnregisterAllValidationInterfaces();
            BOOST_CHECK(!destroyed);
        },
        [&] { destroyed = true; })};
    m_node.validation_signals->RegisterSharedValidationInterface(shared);
    BOOST_CHECK(shared.use_count() == 2);
    shared->Call();
    BOOST_CHECK(shared.use_count() == 1);
    BOOST_CHECK(!destroyed);
    shared.reset();
    BOOST_CHECK(destroyed);
}